

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_command * nk__begin(nk_context *ctx)

{
  undefined4 uVar1;
  nk_vec2 nVar2;
  undefined4 uVar3;
  void *pvVar4;
  void *pvVar5;
  nk_size nVar6;
  nk_window *pnVar7;
  long lVar8;
  nk_cursor *img;
  nk_window *pnVar9;
  nk_window *pnVar10;
  nk_window *pnVar11;
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    return (nk_command *)0x0;
  }
  if (ctx->count == 0) {
    return (nk_command *)0x0;
  }
  pvVar4 = (ctx->memory).memory.ptr;
  if (ctx->build != 0) {
    pnVar7 = ctx->begin;
    goto LAB_0010dc0d;
  }
  img = (ctx->style).cursor_active;
  pvVar5 = pvVar4;
  if (img == (nk_cursor *)0x0) {
    img = (ctx->style).cursors[0];
    (ctx->style).cursor_active = img;
    if (img != (nk_cursor *)0x0) goto LAB_0010da8f;
  }
  else {
LAB_0010da8f:
    if (((ctx->input).mouse.grabbed == '\0') && ((ctx->style).cursor_visible != 0)) {
      (ctx->overlay).base = &ctx->memory;
      (ctx->overlay).use_clipping = 0;
      nVar6 = (ctx->memory).allocated;
      (ctx->overlay).begin = nVar6;
      (ctx->overlay).end = nVar6;
      (ctx->overlay).last = nVar6;
      (ctx->overlay).clip = nk_null_rect;
      nVar2 = (ctx->input).mouse.pos;
      uVar1 = (img->size).x;
      uVar3 = (img->size).y;
      r.h = (float)uVar3;
      r.w = (float)uVar1;
      r.x = nVar2.x - (img->offset).x;
      r.y = nVar2.y - (img->offset).y;
      nk_draw_image(&ctx->overlay,r,&img->img,(nk_color)0xffffffff);
      pvVar5 = (ctx->memory).memory.ptr;
      (ctx->overlay).end = (ctx->memory).allocated;
    }
  }
  pnVar7 = ctx->begin;
  if (pnVar7 != (nk_window *)0x0) {
    lVar8 = 0;
    pnVar11 = pnVar7;
    do {
      nVar6 = (pnVar11->buffer).last;
      pnVar9 = pnVar11->next;
      pnVar10 = pnVar7;
      if (((nVar6 != (pnVar11->buffer).begin) && ((pnVar11->flags & 0x2000) == 0)) &&
         (pnVar11->seq == ctx->seq)) {
        lVar8 = nVar6 + (long)pvVar5;
        while( true ) {
          if (pnVar9 == (nk_window *)0x0) goto LAB_0010dbac;
          nVar6 = (pnVar9->buffer).begin;
          if ((((pnVar9->buffer).last != nVar6) && ((pnVar9->flags & 0x2000) == 0)) &&
             (pnVar9->seq == pnVar11->seq)) break;
          pnVar9 = pnVar9->next;
        }
        *(nk_size *)(lVar8 + 8) = nVar6;
      }
      pnVar11 = pnVar9;
    } while (pnVar9 != (nk_window *)0x0);
LAB_0010dbac:
    do {
      pnVar11 = pnVar10->next;
      if ((pnVar10->popup).buf.active != 0) {
        *(nk_size *)(lVar8 + 8) = (pnVar10->popup).buf.begin;
        lVar8 = (pnVar10->popup).buf.last + (long)pvVar5;
        (pnVar10->popup).buf.active = 0;
      }
      pnVar10 = pnVar11;
    } while (pnVar11 != (nk_window *)0x0);
    if (lVar8 != 0) {
      nVar6 = (ctx->overlay).begin;
      if ((ctx->overlay).end == nVar6) {
        nVar6 = (ctx->memory).allocated;
      }
      *(nk_size *)(lVar8 + 8) = nVar6;
    }
  }
  ctx->build = 1;
LAB_0010dc0d:
  if (pnVar7 == (nk_window *)0x0) {
    return (nk_command *)0x0;
  }
  while (((nVar6 = (pnVar7->buffer).begin, nVar6 == (pnVar7->buffer).end ||
          ((pnVar7->flags & 0x2000) != 0)) || (pnVar7->seq != ctx->seq))) {
    pnVar7 = pnVar7->next;
    if (pnVar7 == (nk_window *)0x0) {
      return (nk_command *)0x0;
    }
  }
  return (nk_command *)((long)pvVar4 + nVar6);
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
struct nk_window *iter;
nk_byte *buffer;
NK_ASSERT(ctx);
if (!ctx) return 0;
if (!ctx->count) return 0;

buffer = (nk_byte*)ctx->memory.memory.ptr;
if (!ctx->build) {
nk_build(ctx);
ctx->build = nk_true;
}
iter = ctx->begin;
while (iter && ((iter->buffer.begin == iter->buffer.end) ||
(iter->flags & NK_WINDOW_HIDDEN) || iter->seq != ctx->seq))
iter = iter->next;
if (!iter) return 0;
return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}